

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

PhysicalType duckdb::EnumTypeInfo::DictType(idx_t size)

{
  PhysicalType PVar1;
  InternalException *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  PVar1 = UINT8;
  if (((0xff < size) && (PVar1 = UINT16, 0xffff < size)) && (PVar1 = UINT32, size >> 0x20 != 0)) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_58,0xffffffff);
    ::std::operator+(&local_38,"Enum size must be lower than ",&sStack_58);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return PVar1;
}

Assistant:

PhysicalType EnumTypeInfo::DictType(idx_t size) {
	if (size <= NumericLimits<uint8_t>::Maximum()) {
		return PhysicalType::UINT8;
	} else if (size <= NumericLimits<uint16_t>::Maximum()) {
		return PhysicalType::UINT16;
	} else if (size <= NumericLimits<uint32_t>::Maximum()) {
		return PhysicalType::UINT32;
	} else {
		throw InternalException("Enum size must be lower than " + std::to_string(NumericLimits<uint32_t>::Maximum()));
	}
}